

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O0

long __thiscall PFData::getPointOffset(PFData *this,int z,int y,int x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  PFData *in_RDI;
  long pointOffset;
  long subgridOffset;
  int sizeX;
  int sizeY;
  int sizeZ;
  int remX;
  int remY;
  int remZ;
  int gridX;
  int gridY;
  int gridZ;
  int in_stack_ffffffffffffffac;
  PFData *in_stack_ffffffffffffffb8;
  PFData *in_stack_ffffffffffffffc0;
  
  getSubgridIndexZ(in_stack_ffffffffffffffb8,(int)((ulong)in_RDI >> 0x20));
  getSubgridIndexY(in_stack_ffffffffffffffb8,(int)((ulong)in_RDI >> 0x20));
  getSubgridIndexX(in_stack_ffffffffffffffb8,(int)((ulong)in_RDI >> 0x20));
  iVar1 = getSubgridStartZ(in_RDI,in_stack_ffffffffffffffac);
  iVar2 = getSubgridStartY(in_RDI,in_stack_ffffffffffffffac);
  iVar3 = getSubgridStartX(in_RDI,in_ECX);
  iVar3 = in_ECX - iVar3;
  getSubgridSizeZ(in_RDI,in_ECX);
  iVar4 = getSubgridSizeY(in_RDI,in_ECX);
  iVar5 = getSubgridSizeX(in_RDI,in_ECX);
  lVar6 = getSubgridOffset(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20)
                           ,(int)in_stack_ffffffffffffffb8,(int)((ulong)in_RDI >> 0x20));
  return lVar6 + 0x24 +
         (long)(((in_ESI - iVar1) * iVar4 * iVar5 + (in_EDX - iVar2) * iVar5 + iVar3) * 8);
}

Assistant:

long PFData::getPointOffset(int z, int y, int x) const{
    const int gridZ = getSubgridIndexZ(z);
    const int gridY = getSubgridIndexY(y);
    const int gridX = getSubgridIndexX(x);

    const int remZ = z - getSubgridStartZ(gridZ);
    const int remY = y - getSubgridStartY(gridY);
    const int remX = x - getSubgridStartX(gridX);

    const int sizeZ = getSubgridSizeZ(gridZ);
    const int sizeY = getSubgridSizeY(gridY);
    const int sizeX = getSubgridSizeX(gridX);

    const long subgridOffset = getSubgridOffset(gridZ, gridY, gridX) + 36;  //Skip header
    const long pointOffset = 8 * ((remZ * sizeY * sizeX) + (remY * sizeX) + remX);
    return subgridOffset + pointOffset;
}